

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O3

bool __thiscall SkeletalMesh::Material::setDiffuse(Material *this,string *_name,string *_filename)

{
  pointer pcVar1;
  Texture *pTVar2;
  string local_60;
  string local_40;
  
  pcVar1 = (_name->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + _name->_M_string_length);
  pcVar1 = (_filename->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + _filename->_M_string_length);
  pTVar2 = TextureImage::Texture::loadTexture(&local_40,&local_60);
  this->diffuse = pTVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return pTVar2 != (Texture *)TextureImage::Texture::error;
}

Assistant:

bool setDiffuse(std::string _name, std::string _filename = std::string()) {
            return (diffuse = &TextureImage::Texture::loadTexture(_name, _filename))
                   != &TextureImage::Texture::error;
        }